

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDerivateTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::TextureDerivateCase::setupRenderState
          (TextureDerivateCase *this,deUint32 program)

{
  code *UNRECOVERED_JUMPTABLE;
  int iVar1;
  undefined4 uVar2;
  undefined4 extraout_var;
  long lVar3;
  
  iVar1 = (*((this->super_TriangleDerivateCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 8))(0x84c1);
  (**(code **)(lVar3 + 0xb8))(0xde1,this->m_texture->m_glTexture);
  (**(code **)(lVar3 + 0x1360))(0xde1,0x2801,0x2600);
  (**(code **)(lVar3 + 0x1360))(0xde1,0x2800,0x2600);
  (**(code **)(lVar3 + 0x1360))(0xde1,0x2802,0x812f);
  (**(code **)(lVar3 + 0x1360))(0xde1,0x2803,0x812f);
  UNRECOVERED_JUMPTABLE = *(code **)(lVar3 + 0x14f0);
  uVar2 = (**(code **)(lVar3 + 0xb48))(program,"u_sampler");
  (*UNRECOVERED_JUMPTABLE)(uVar2,1);
  return;
}

Assistant:

void TextureDerivateCase::setupRenderState (deUint32 program)
{
	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	const int				texUnit		= 1;

	gl.activeTexture	(GL_TEXTURE0+texUnit);
	gl.bindTexture		(GL_TEXTURE_2D, m_texture->getGLTexture());
	gl.texParameteri	(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	GL_NEAREST);
	gl.texParameteri	(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	GL_NEAREST);
	gl.texParameteri	(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
	gl.texParameteri	(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);

	gl.uniform1i		(gl.getUniformLocation(program, "u_sampler"), texUnit);
}